

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O0

int VP8EncStartAlpha(VP8Encoder *enc)

{
  int iVar1;
  WebPWorkerInterface *pWVar2;
  long in_RDI;
  WebPWorker *worker;
  void *in_stack_00000020;
  void *in_stack_00000028;
  int local_4;
  
  if (*(int *)(in_RDI + 0x21c) == 0) {
    local_4 = 1;
  }
  else if (*(int *)(in_RDI + 0x5c50) < 1) {
    local_4 = CompressAlphaJob(in_stack_00000028,in_stack_00000020);
  }
  else {
    pWVar2 = WebPGetWorkerInterface();
    iVar1 = (*pWVar2->Reset)((WebPWorker *)(in_RDI + 0x230));
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      pWVar2 = WebPGetWorkerInterface();
      (*pWVar2->Launch)((WebPWorker *)(in_RDI + 0x230));
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int VP8EncStartAlpha(VP8Encoder* const enc) {
  if (enc->has_alpha_) {
    if (enc->thread_level_ > 0) {
      WebPWorker* const worker = &enc->alpha_worker_;
      // Makes sure worker is good to go.
      if (!WebPGetWorkerInterface()->Reset(worker)) {
        return 0;
      }
      WebPGetWorkerInterface()->Launch(worker);
      return 1;
    } else {
      return CompressAlphaJob(enc, NULL);   // just do the job right away
    }
  }
  return 1;
}